

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O1

int waitforclifortcpsrv(SOCKET socksrv,SOCKET *pSockCli,int timeout)

{
  int iVar1;
  int iVar2;
  timeval *__timeout;
  ulong uVar3;
  socklen_t addrlen;
  timeval tv;
  fd_set sock_set;
  char service [32];
  sockaddr_storage addr;
  char hostname [1025];
  socklen_t local_56c;
  timeval local_568;
  fd_set local_558;
  char local_4d8 [32];
  sockaddr local_4b8;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  char local_438 [1040];
  
  local_56c = 0x80;
  local_568.tv_sec = (__time_t)(timeout / 1000);
  local_568.tv_usec = (__suseconds_t)((timeout % 1000) * 1000);
  *pSockCli = -1;
  local_558.fds_bits[0xe] = 0;
  local_558.fds_bits[0xf] = 0;
  local_558.fds_bits[0xc] = 0;
  local_558.fds_bits[0xd] = 0;
  local_558.fds_bits[10] = 0;
  local_558.fds_bits[0xb] = 0;
  local_558.fds_bits[8] = 0;
  local_558.fds_bits[9] = 0;
  local_558.fds_bits[6] = 0;
  local_558.fds_bits[7] = 0;
  local_558.fds_bits[4] = 0;
  local_558.fds_bits[5] = 0;
  local_558.fds_bits[2] = 0;
  local_558.fds_bits[3] = 0;
  local_558.fds_bits[0] = 0;
  local_558.fds_bits[1] = 0;
  iVar2 = socksrv + 0x3f;
  if (-1 < socksrv) {
    iVar2 = socksrv;
  }
  uVar3 = 1L << ((byte)(socksrv % 0x40) & 0x3f);
  local_558.fds_bits[iVar2 >> 6] = local_558.fds_bits[iVar2 >> 6] | uVar3;
  if (timeout == 0) {
    __timeout = (timeval *)0x0;
  }
  else {
    __timeout = &local_568;
  }
  iVar1 = select(socksrv + 1,&local_558,(fd_set *)0x0,(fd_set *)0x0,__timeout);
  local_558.fds_bits[iVar2 >> 6] = local_558.fds_bits[iVar2 >> 6] & ~uVar3;
  iVar2 = 1;
  if (iVar1 != -1) {
    if (iVar1 == 0) {
      iVar2 = 2;
    }
    else {
      local_448 = 0;
      uStack_440 = 0;
      local_458 = 0;
      uStack_450 = 0;
      local_468 = 0;
      uStack_460 = 0;
      local_478 = 0;
      uStack_470 = 0;
      local_488 = 0;
      uStack_480 = 0;
      local_498 = 0;
      uStack_490 = 0;
      local_4a8 = 0;
      uStack_4a0 = 0;
      local_4b8.sa_family = 0;
      local_4b8.sa_data[0] = '\0';
      local_4b8.sa_data[1] = '\0';
      local_4b8.sa_data[2] = '\0';
      local_4b8.sa_data[3] = '\0';
      local_4b8.sa_data[4] = '\0';
      local_4b8.sa_data[5] = '\0';
      local_4b8.sa_data[6] = '\0';
      local_4b8.sa_data[7] = '\0';
      local_4b8.sa_data[8] = '\0';
      local_4b8.sa_data[9] = '\0';
      local_4b8.sa_data[10] = '\0';
      local_4b8.sa_data[0xb] = '\0';
      local_4b8.sa_data[0xc] = '\0';
      local_4b8.sa_data[0xd] = '\0';
      local_56c = 0x80;
      iVar1 = accept(socksrv,&local_4b8,&local_56c);
      *pSockCli = iVar1;
      if (iVar1 != -1) {
        iVar1 = getnameinfo(&local_4b8,local_56c,local_438,0x401,local_4d8,0x20,3);
        if (iVar1 == 0) {
          iVar2 = 0;
        }
        else {
          close(*pSockCli);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

inline int waitforclifortcpsrv(SOCKET socksrv, SOCKET* pSockCli, int timeout)
{
	fd_set sock_set;
	int iResult = SOCKET_ERROR;
	struct timeval tv;
	struct sockaddr_storage addr;
	socklen_t addrlen = sizeof(struct sockaddr_storage);
	char hostname[NI_MAXHOST];
	char service[NI_MAXSERV];

	tv.tv_sec = (long)(timeout/1000);
	tv.tv_usec = (long)((timeout%1000)*1000);

	*pSockCli = INVALID_SOCKET;

	// Initialize a fd_set and add the server socket to it.
	FD_ZERO(&sock_set); 
	FD_SET(socksrv, &sock_set);

	// Wait for the readability of the socket in the fd_set, with a timeout.
	if (timeout != 0)
	{
		iResult = select((int)socksrv+1, &sock_set, NULL, NULL, &tv);
	}
	else
	{
		iResult = select((int)socksrv+1, &sock_set, NULL, NULL, NULL);
	}

	// Remove the server socket from the set.
	// No need to use FD_ISSET() here, as we only have one socket the return value of select() is 
	// sufficient to know what happened.
	FD_CLR(socksrv, &sock_set); 

	if (iResult == SOCKET_ERROR)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforclifortcpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			"select failed. ", 
			(int)socksrv, timeout));
		return EXIT_FAILURE;
	}

	if (iResult == 0)
	{ 
		PRINT_DEBUG_MESSAGE_OSNET(("waitforclifortcpsrv message (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			"select timed out. ", 
			(int)socksrv, timeout));
		return EXIT_TIMEOUT;
	}

	memset(&addr, 0, sizeof(addr));
	addrlen = sizeof(addr);
	*pSockCli = accept(socksrv, (struct sockaddr*)&addr, &addrlen);
	if (*pSockCli == INVALID_SOCKET)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforclifortcpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			"accept failed. ", 
			(int)socksrv, timeout));
		return EXIT_FAILURE;
	}

	// Display hostname and service.
	if (getnameinfo((struct sockaddr*)&addr, addrlen, hostname, NI_MAXHOST, service,
		NI_MAXSERV, NI_NUMERICHOST|NI_NUMERICSERV) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforclifortcpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			"getnameinfo failed. ", 
			(int)socksrv, timeout));
		closesocket(*pSockCli);
		return EXIT_FAILURE;
	}

	PRINT_DEBUG_MESSAGE_OSNET(("Accepted connection from host %s and port %s\n", hostname, service));

	return EXIT_SUCCESS;
}